

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SparseLU_Memory.h
# Opt level: O3

int __thiscall
Eigen::internal::SparseLUImpl<double,int>::expand<Eigen::Matrix<int,_1,1,0,_1,1>>
          (SparseLUImpl<double,int> *this,Matrix<int,__1,_1,_0,__1,_1> *vec,int *length,int nbElts,
          int keep_prev,int *num_expansions)

{
  int iVar1;
  int *piVar2;
  uint uVar3;
  ulong uVar4;
  ulong uVar5;
  undefined8 *puVar6;
  int iVar7;
  int iVar8;
  long lVar9;
  Index size;
  ulong uVar10;
  ulong uVar11;
  int local_50;
  void *local_48;
  
  iVar1 = *length;
  iVar8 = iVar1;
  if ((keep_prev == 0) && (*num_expansions != 0)) {
    iVar8 = iVar1 + 1;
    if (iVar1 + 1 <= (int)((float)iVar1 * 1.5)) {
      iVar8 = (int)((float)iVar1 * 1.5);
    }
  }
  uVar10 = (ulong)(uint)nbElts;
  if (nbElts < 1) {
    local_50 = 0;
    local_48 = (void *)0x0;
  }
  else {
    if ((vec->super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>).m_storage.m_rows <
        (long)uVar10) goto LAB_001512a4;
    piVar2 = (vec->super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>).m_storage.m_data;
    local_48 = malloc(uVar10 * 4);
    if (local_48 == (void *)0x0) {
      puVar6 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar6 = std::streambuf::xsgetn;
      __cxa_throw(puVar6,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
    }
    if (3 < (uint)nbElts) {
      memcpy(local_48,piVar2,(ulong)(nbElts & 0x7ffffffcU) * 4);
    }
    local_50 = nbElts;
    if ((nbElts & 0x7ffffffcU) != nbElts) {
      uVar4 = (ulong)((uint)nbElts >> 2);
      memcpy((void *)((long)local_48 + uVar4 * 0x10),piVar2 + uVar4 * 4,uVar10 * 4 + uVar4 * -0x10);
    }
  }
  PlainObjectBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>_>::resize
            (&vec->super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>,(long)iVar8);
  if (nbElts < 1) goto LAB_0015126b;
  if ((vec->super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>).m_storage.m_rows <
      (long)uVar10) {
LAB_001512a4:
    __assert_fail("a_startRow >= 0 && blockRows >= 0 && a_startRow <= xpr.rows() - blockRows && a_startCol >= 0 && blockCols >= 0 && a_startCol <= xpr.cols() - blockCols"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/UI233[P]Denoiser/./Eigen/src/Core/Block.h"
                  ,0x8d,
                  "Eigen::Block<Eigen::Matrix<int, -1, 1>, -1, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Matrix<int, -1, 1>, BlockRows = -1, BlockCols = 1, InnerPanel = false]"
                 );
  }
  if (local_50 != nbElts) {
    __assert_fail("rows() == other.rows() && cols() == other.cols()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/UI233[P]Denoiser/./Eigen/src/Core/Assign.h"
                  ,0x1f2,
                  "Derived &Eigen::DenseBase<Eigen::Block<Eigen::Matrix<int, -1, 1>, -1, 1>>::lazyAssign(const DenseBase<OtherDerived> &) [Derived = Eigen::Block<Eigen::Matrix<int, -1, 1>, -1, 1>, OtherDerived = Eigen::Matrix<int, -1, 1>]"
                 );
  }
  piVar2 = (vec->super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>).m_storage.m_data;
  uVar4 = uVar10;
  if (((ulong)piVar2 & 3) == 0) {
    uVar3 = -((uint)((ulong)piVar2 >> 2) & 0x3fffffff) & 3;
    if (uVar3 < uVar10) {
      uVar4 = (ulong)uVar3;
    }
    lVar9 = uVar10 - uVar4;
    iVar1 = (int)lVar9;
    iVar7 = iVar1 + 3;
    if (-1 < iVar1) {
      iVar7 = iVar1;
    }
    uVar11 = uVar4 + (ulong)(uint)(iVar7 >> 2) * 4;
    if (uVar3 != 0) goto LAB_00151202;
    uVar4 = 0;
  }
  else {
    lVar9 = 0;
    uVar11 = uVar10;
LAB_00151202:
    memcpy(piVar2,local_48,uVar4 * 4);
  }
  if (3 < lVar9) {
    uVar5 = uVar4 + 4;
    if (uVar4 + 4 < uVar11) {
      uVar5 = uVar11;
    }
    memcpy(piVar2 + uVar4,(void *)((long)local_48 + uVar4 * 4),
           (~uVar4 + uVar5 & 0xfffffffffffffffc) * 4 + 0x10);
  }
  if (uVar11 <= uVar10 && uVar10 - uVar11 != 0) {
    memcpy(piVar2 + uVar11,(void *)((long)local_48 + uVar11 * 4),(uVar10 - uVar11) * 4);
  }
LAB_0015126b:
  *length = iVar8;
  if (*num_expansions != 0) {
    *num_expansions = *num_expansions + 1;
  }
  free(local_48);
  return 0;
}

Assistant:

Index  SparseLUImpl<Scalar,Index>::expand(VectorType& vec, Index& length, Index nbElts, Index keep_prev, Index& num_expansions) 
{
  
  float alpha = 1.5; // Ratio of the memory increase 
  Index new_len; // New size of the allocated memory
  
  if(num_expansions == 0 || keep_prev) 
    new_len = length ; // First time allocate requested
  else 
    new_len = (std::max)(length+1,Index(alpha * length));
  
  VectorType old_vec; // Temporary vector to hold the previous values   
  if (nbElts > 0 )
    old_vec = vec.segment(0,nbElts); 
  
  //Allocate or expand the current vector
#ifdef EIGEN_EXCEPTIONS
  try
#endif
  {
    vec.resize(new_len); 
  }
#ifdef EIGEN_EXCEPTIONS
  catch(std::bad_alloc& )
#else
  if(!vec.size())
#endif
  {
    if (!num_expansions)
    {
      // First time to allocate from LUMemInit()
      // Let LUMemInit() deals with it.
      return -1;
    }
    if (keep_prev)
    {
      // In this case, the memory length should not not be reduced
      return new_len;
    }
    else 
    {
      // Reduce the size and increase again 
      Index tries = 0; // Number of attempts
      do 
      {
        alpha = (alpha + 1)/2;
        new_len = (std::max)(length+1,Index(alpha * length));
#ifdef EIGEN_EXCEPTIONS
        try
#endif
        {
          vec.resize(new_len); 
        }
#ifdef EIGEN_EXCEPTIONS
        catch(std::bad_alloc& )
#else
        if (!vec.size())
#endif
        {
          tries += 1; 
          if ( tries > 10) return new_len; 
        }
      } while (!vec.size());
    }
  }
  //Copy the previous values to the newly allocated space 
  if (nbElts > 0)
    vec.segment(0, nbElts) = old_vec;   
   
  
  length  = new_len;
  if(num_expansions) ++num_expansions;
  return 0; 
}